

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  bool bVar5;
  bool bVar6;
  OPJ_FLOAT64 OVar7;
  OPJ_FLOAT64 OVar8;
  undefined1 auVar9 [16];
  OPJ_UINT32 l_data_size;
  OPJ_BYTE *l_data;
  OPJ_FLOAT64 t;
  OPJ_UINT32 l_nb_tiles;
  OPJ_BOOL bUseTiles;
  OPJ_BOOL bSuccess;
  int ret;
  dircnt_t *dirptr;
  img_fol_t img_fol;
  uint local_5980;
  uint imageno;
  uint num_images;
  uint i;
  char indexfilename [4096];
  OPJ_SIZE_T num_compressed_files;
  raw_cparameters_t raw_cp;
  opj_image_t *image;
  opj_codec_t *l_codec;
  opj_stream_t *l_stream;
  opj_cparameters_t parameters;
  char **argv_local;
  int argc_local;
  
  l_codec = (opj_codec_t *)0x0;
  raw_cp.rawComps = (raw_comp_cparameters_t *)0x0;
  indexfilename[0xff8] = '\0';
  indexfilename[0xff9] = '\0';
  indexfilename[0xffa] = '\0';
  indexfilename[0xffb] = '\0';
  indexfilename[0xffc] = '\0';
  indexfilename[0xffd] = '\0';
  indexfilename[0xffe] = '\0';
  indexfilename[0xfff] = '\0';
  _bSuccess = (dircnt_t *)0x0;
  parameters._18712_8_ = argv;
  OVar7 = opj_clock();
  opj_set_default_encoder_parameters(&l_stream);
  num_images._0_1_ = 0;
  memset(&dirptr,0,0x18);
  raw_cp.rawHeight = 0;
  raw_cp.rawWidth = 0;
  raw_cp.rawSigned = 0;
  raw_cp._20_4_ = 0;
  num_compressed_files._4_4_ = 0;
  raw_cp.rawComp = 0;
  num_compressed_files._0_4_ = 0;
  parameters.max_comp_size._2_1_ = -1;
  iVar2 = parse_cmdline_encoder
                    (argc,(char **)parameters._18712_8_,(opj_cparameters_t *)&l_stream,
                     (img_fol_t *)&dirptr,(raw_cparameters_t *)&num_compressed_files,
                     (char *)&num_images,0x1000);
  if (iVar2 == 1) {
    bUseTiles = 1;
    goto LAB_001043ed;
  }
  if ((char)img_fol.out_format == '\x01') {
    local_5980 = get_num_images((char *)dirptr);
    _bSuccess = (dircnt_t *)malloc(0x10);
    if (_bSuccess != (dircnt_t *)0x0) {
      pcVar3 = (char *)malloc((ulong)(local_5980 << 0xc));
      _bSuccess->filename_buf = pcVar3;
      ppcVar4 = (char **)malloc((ulong)local_5980 << 3);
      _bSuccess->filename = ppcVar4;
      if (_bSuccess->filename_buf == (char *)0x0) {
        bUseTiles = 0;
        goto LAB_001043ed;
      }
      for (imageno = 0; imageno < local_5980; imageno = imageno + 1) {
        _bSuccess->filename[imageno] = _bSuccess->filename_buf + (imageno << 0xc);
      }
    }
    iVar2 = load_images(_bSuccess,(char *)dirptr);
    if (iVar2 == 1) {
      bUseTiles = 0;
      goto LAB_001043ed;
    }
    if (local_5980 == 0) {
      fprintf(_stdout,"Folder is empty\n");
      bUseTiles = 0;
      goto LAB_001043ed;
    }
  }
  else {
    local_5980 = 1;
  }
  for (img_fol._20_4_ = 0; (uint)img_fol._20_4_ < local_5980; img_fol._20_4_ = img_fol._20_4_ + 1) {
    raw_cp.rawComps = (raw_comp_cparameters_t *)0x0;
    fprintf(_stderr,"\n");
    if (((char)img_fol.out_format == '\x01') &&
       (cVar1 = get_next_file(img_fol._20_4_,_bSuccess,(img_fol_t *)&dirptr,
                              (opj_cparameters_t *)&l_stream), cVar1 != '\0')) {
      fprintf(_stderr,"skipping file...\n");
    }
    else {
      switch(parameters.subsampling_dx) {
      case 10:
        break;
      case 0xb:
        break;
      case 0xc:
        break;
      default:
        fprintf(_stderr,"skipping file...\n");
        goto LAB_00104352;
      case 0xe:
        break;
      case 0xf:
      case 0x12:
        break;
      case 0x10:
        break;
      case 0x11:
      }
      switch(parameters.subsampling_dx) {
      case 10:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             pnmtoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load pnm file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0xb:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             pgxtoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load pgx file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0xc:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             bmptoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load bmp file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0xe:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             tiftoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load tiff file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0xf:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             rawtoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream,
                        (raw_cparameters_t *)&num_compressed_files);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load raw file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0x10:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             tgatoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load tga file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0x11:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             pngtoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load png file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        break;
      case 0x12:
        raw_cp.rawComps =
             (raw_comp_cparameters_t *)
             rawltoimage((char *)(parameters.prch_init + 0x1f),(opj_cparameters_t *)&l_stream,
                         (raw_cparameters_t *)&num_compressed_files);
        if ((opj_image_t *)raw_cp.rawComps == (opj_image_t *)0x0) {
          fprintf(_stderr,"Unable to load raw file\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
      }
      if (raw_cp.rawComps == (raw_comp_cparameters_t *)0x0) {
        fprintf(_stderr,"Unable to load file: got no image\n");
        bUseTiles = 1;
        goto LAB_001043ed;
      }
      if (parameters.max_comp_size._2_1_ == -1) {
        parameters.max_comp_size._2_1_ = 2 < (uint)raw_cp.rawComps[2].dx;
      }
      else {
        if ((parameters.max_comp_size._2_1_ == '\x01') && ((uint)raw_cp.rawComps[2].dx < 3)) {
          fprintf(_stderr,"RGB->YCC conversion cannot be used:\n");
          fprintf(_stderr,"Input image has less than 3 components\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
        if ((parameters.max_comp_size._2_1_ == '\x02') && (parameters._18696_8_ == 0)) {
          fprintf(_stderr,"Custom MCT has been set but no array-based MCT\n");
          fprintf(_stderr,"has been provided. Aborting.\n");
          bUseTiles = 1;
          goto LAB_001043ed;
        }
      }
      if (parameters.subsampling_dy == 0) {
        image = (opj_image_t *)opj_create_compress(0);
      }
      else {
        if (parameters.subsampling_dy != 1) {
          fprintf(_stderr,"skipping file..\n");
          opj_stream_destroy(l_codec);
          goto LAB_00104352;
        }
        image = (opj_image_t *)opj_create_compress(2);
      }
      opj_set_info_handler(image,info_callback,0);
      opj_set_warning_handler(image,warning_callback,0);
      opj_set_error_handler(image,error_callback,0);
      iVar2 = opj_setup_encoder(image,&l_stream,raw_cp.rawComps);
      if (iVar2 == 0) {
        fprintf(_stderr,"failed to encode image: opj_setup_encoder\n");
        opj_destroy_codec(image);
        opj_image_destroy(raw_cp.rawComps);
        bUseTiles = 1;
        goto LAB_001043ed;
      }
      l_codec = (opj_codec_t *)opj_stream_create_default_file_stream(parameters.infile + 0xff8,0);
      if (l_codec == (opj_codec_t *)0x0) {
        bUseTiles = 1;
        goto LAB_001043ed;
      }
      iVar2 = opj_start_compress(image,raw_cp.rawComps,l_codec);
      if (iVar2 == 0) {
        fprintf(_stderr,"failed to encode image: opj_start_compress\n");
      }
      bVar5 = false;
      if (iVar2 != 0) {
        iVar2 = opj_encode(image,l_codec);
        bVar5 = iVar2 != 0;
      }
      if (!bVar5) {
        fprintf(_stderr,"failed to encode image: opj_encode\n");
      }
      bVar6 = false;
      if (bVar5) {
        iVar2 = opj_end_compress(image,l_codec);
        bVar6 = iVar2 != 0;
      }
      if (!bVar6) {
        fprintf(_stderr,"failed to encode image: opj_end_compress\n");
        opj_stream_destroy(l_codec);
        opj_destroy_codec(image);
        opj_image_destroy(raw_cp.rawComps);
        fprintf(_stderr,"failed to encode image\n");
        remove(parameters.infile + 0xff8);
        bUseTiles = 1;
        goto LAB_001043ed;
      }
      indexfilename._4088_8_ = indexfilename._4088_8_ + 1;
      fprintf(_stdout,"[INFO] Generated outfile %s\n",parameters.infile + 0xff8);
      opj_stream_destroy(l_codec);
      opj_destroy_codec(image);
      opj_image_destroy(raw_cp.rawComps);
    }
LAB_00104352:
  }
  OVar8 = opj_clock();
  if (indexfilename._4088_8_ != 0) {
    auVar9._8_4_ = SUB84(indexfilename._4088_8_,4);
    auVar9[0] = indexfilename[0xff8];
    auVar9[1] = indexfilename[0xff9];
    auVar9[2] = indexfilename[0xffa];
    auVar9[3] = indexfilename[0xffb];
    auVar9[4] = indexfilename[0xffc];
    auVar9[5] = indexfilename[0xffd];
    auVar9[6] = indexfilename[0xffe];
    auVar9[7] = indexfilename[0xfff];
    auVar9._12_4_ = 0x45300000;
    fprintf(_stdout,"encode time: %d ms \n",
            (ulong)(uint)(int)((((double)OVar8 - (double)OVar7) * 1000.0) /
                              ((auVar9._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)indexfilename._4088_8_) -
                              4503599627370496.0))));
  }
  bUseTiles = 0;
LAB_001043ed:
  if (parameters.cp_matrice != (int *)0x0) {
    free(parameters.cp_matrice);
  }
  if (parameters._24_8_ != 0) {
    free((void *)parameters._24_8_);
  }
  if (raw_cp._16_8_ != 0) {
    free((void *)raw_cp._16_8_);
  }
  if (dirptr != (dircnt_t *)0x0) {
    free(dirptr);
  }
  if (_bSuccess != (dircnt_t *)0x0) {
    if (_bSuccess->filename_buf != (char *)0x0) {
      free(_bSuccess->filename_buf);
    }
    if (_bSuccess->filename != (char **)0x0) {
      free(_bSuccess->filename);
    }
    free(_bSuccess);
  }
  return bUseTiles;
}

Assistant:

int main(int argc, char **argv)
{

    opj_cparameters_t parameters;   /* compression parameters */

    opj_stream_t *l_stream = 00;
    opj_codec_t* l_codec = 00;
    opj_image_t *image = NULL;
    raw_cparameters_t raw_cp;
    OPJ_SIZE_T num_compressed_files = 0;

    char indexfilename[OPJ_PATH_LEN];   /* index file name */

    unsigned int i, num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    int ret = 0;

    OPJ_BOOL bSuccess;
    OPJ_BOOL bUseTiles = OPJ_FALSE; /* OPJ_TRUE */
    OPJ_UINT32 l_nb_tiles = 4;
    OPJ_FLOAT64 t = opj_clock();

    /* set encoding parameters to default values */
    opj_set_default_encoder_parameters(&parameters);

    /* Initialize indexfilename and img_fol */
    *indexfilename = 0;
    memset(&img_fol, 0, sizeof(img_fol_t));

    /* raw_cp initialization */
    raw_cp.rawBitDepth = 0;
    raw_cp.rawComp = 0;
    raw_cp.rawComps = 0;
    raw_cp.rawHeight = 0;
    raw_cp.rawSigned = 0;
    raw_cp.rawWidth = 0;

    /* parse input and get user encoding parameters */
    parameters.tcp_mct = (char)
                         255; /* This will be set later according to the input image or the provided option */
    if (parse_cmdline_encoder(argc, argv, &parameters, &img_fol, &raw_cp,
                              indexfilename, sizeof(indexfilename)) == 1) {
        ret = 1;
        goto fin;
    }

    /* Read directory if necessary */
    if (img_fol.set_imgdir == 1) {
        num_images = get_num_images(img_fol.imgdirpath);
        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (dirptr) {
            dirptr->filename_buf = (char*)malloc(num_images * OPJ_PATH_LEN * sizeof(
                    char)); /* Stores at max 10 image file names*/
            dirptr->filename = (char**) malloc(num_images * sizeof(char*));
            if (!dirptr->filename_buf) {
                ret = 0;
                goto fin;
            }
            for (i = 0; i < num_images; i++) {
                dirptr->filename[i] = dirptr->filename_buf + i * OPJ_PATH_LEN;
            }
        }
        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            ret = 0;
            goto fin;
        }
        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            ret = 0;
            goto fin;
        }
    } else {
        num_images = 1;
    }
    /*Encoding image one by one*/
    for (imageno = 0; imageno < num_images; imageno++) {
        image = NULL;
        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file((int)imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        switch (parameters.decod_format) {
        case PGX_DFMT:
            break;
        case PXM_DFMT:
            break;
        case BMP_DFMT:
            break;
        case TIF_DFMT:
            break;
        case RAW_DFMT:
        case RAWL_DFMT:
            break;
        case TGA_DFMT:
            break;
        case PNG_DFMT:
            break;
        default:
            fprintf(stderr, "skipping file...\n");
            continue;
        }

        /* decode the source image */
        /* ----------------------- */

        switch (parameters.decod_format) {
        case PGX_DFMT:
            image = pgxtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pgx file\n");
                ret = 1;
                goto fin;
            }
            break;

        case PXM_DFMT:
            image = pnmtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pnm file\n");
                ret = 1;
                goto fin;
            }
            break;

        case BMP_DFMT:
            image = bmptoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load bmp file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBTIFF
        case TIF_DFMT:
            image = tiftoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tiff file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBTIFF */

        case RAW_DFMT:
            image = rawtoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case RAWL_DFMT:
            image = rawltoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case TGA_DFMT:
            image = tgatoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tga file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBPNG
        case PNG_DFMT:
            image = pngtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load png file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBPNG */
        }

        /* Can happen if input file is TIFF or PNG
        * and OPJ_HAVE_LIBTIF or OPJ_HAVE_LIBPNG is undefined
        */
        if (!image) {
            fprintf(stderr, "Unable to load file: got no image\n");
            ret = 1;
            goto fin;
        }

        /* Decide if MCT should be used */
        if (parameters.tcp_mct == (char)
                255) { /* mct mode has not been set in commandline */
            parameters.tcp_mct = (image->numcomps >= 3) ? 1 : 0;
        } else {            /* mct mode has been set in commandline */
            if ((parameters.tcp_mct == 1) && (image->numcomps < 3)) {
                fprintf(stderr, "RGB->YCC conversion cannot be used:\n");
                fprintf(stderr, "Input image has less than 3 components\n");
                ret = 1;
                goto fin;
            }
            if ((parameters.tcp_mct == 2) && (!parameters.mct_data)) {
                fprintf(stderr, "Custom MCT has been set but no array-based MCT\n");
                fprintf(stderr, "has been provided. Aborting.\n");
                ret = 1;
                goto fin;
            }
        }

        /* encode the destination image */
        /* ---------------------------- */

        switch (parameters.cod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_JP2);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        if (bUseTiles) {
            parameters.cp_tx0 = 0;
            parameters.cp_ty0 = 0;
            parameters.tile_size_on = OPJ_TRUE;
            parameters.cp_tdx = 512;
            parameters.cp_tdy = 512;
        }
        if (! opj_setup_encoder(l_codec, &parameters, image)) {
            fprintf(stderr, "failed to encode image: opj_setup_encoder\n");
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            ret = 1;
            goto fin;
        }

        /* open a byte stream for writing and allocate memory for all tiles */
        l_stream = opj_stream_create_default_file_stream(parameters.outfile, OPJ_FALSE);
        if (! l_stream) {
            ret = 1;
            goto fin;
        }

        /* encode the image */
        bSuccess = opj_start_compress(l_codec, image, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_start_compress\n");
        }
        if (bSuccess && bUseTiles) {
            OPJ_BYTE *l_data;
            OPJ_UINT32 l_data_size = 512 * 512 * 3;
            l_data = (OPJ_BYTE*) calloc(1, l_data_size);
            if (l_data == NULL) {
                ret = 1;
                goto fin;
            }
            for (i = 0; i < l_nb_tiles; ++i) {
                if (! opj_write_tile(l_codec, i, l_data, l_data_size, l_stream)) {
                    fprintf(stderr, "ERROR -> test_tile_encoder: failed to write the tile %d!\n",
                            i);
                    opj_stream_destroy(l_stream);
                    opj_destroy_codec(l_codec);
                    opj_image_destroy(image);
                    ret = 1;
                    goto fin;
                }
            }
            free(l_data);
        } else {
            bSuccess = bSuccess && opj_encode(l_codec, l_stream);
            if (!bSuccess)  {
                fprintf(stderr, "failed to encode image: opj_encode\n");
            }
        }
        bSuccess = bSuccess && opj_end_compress(l_codec, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_end_compress\n");
        }

        if (!bSuccess)  {
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fprintf(stderr, "failed to encode image\n");
            remove(parameters.outfile);
            ret = 1;
            goto fin;
        }

        num_compressed_files++;
        fprintf(stdout, "[INFO] Generated outfile %s\n", parameters.outfile);
        /* close and free the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining compression structures */
        opj_destroy_codec(l_codec);

        /* free image data */
        opj_image_destroy(image);

    }

    t = opj_clock() - t;
    if (num_compressed_files) {
        fprintf(stdout, "encode time: %d ms \n",
                (int)((t * 1000.0) / (OPJ_FLOAT64)num_compressed_files));
    }

    ret = 0;

fin:
    if (parameters.cp_comment) {
        free(parameters.cp_comment);
    }
    if (parameters.cp_matrice) {
        free(parameters.cp_matrice);
    }
    if (raw_cp.rawComps) {
        free(raw_cp.rawComps);
    }
    if (img_fol.imgdirpath) {
        free(img_fol.imgdirpath);
    }
    if (dirptr) {
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        free(dirptr);
    }
    return ret;
}